

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListExpression.cpp
# Opt level: O0

void __thiscall hdc::ListExpression::~ListExpression(ListExpression *this)

{
  size_type sVar1;
  reference ppEVar2;
  int local_14;
  int i;
  ListExpression *this_local;
  
  (this->super_Expression).super_Statement.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220b08;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::size
                      (&this->expressions);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppEVar2 = std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::operator[]
                        (&this->expressions,(long)local_14);
    if (*ppEVar2 != (value_type)0x0) {
      (*((*ppEVar2)->super_Statement).super_ASTNode._vptr_ASTNode[2])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::~vector(&this->expressions);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

ListExpression::~ListExpression() {
    for (int i = 0; i < expressions.size(); ++i) {
        delete expressions[i];
    }
}